

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

void Cnf_CollectVolume(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  undefined4 local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vLeaves), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,local_34);
    Aig_ObjSetTravIdCurrent(p,pObj_00);
  }
  Vec_PtrClear(vNodes);
  Cnf_CollectVolume_rec(p,pRoot,vNodes);
  return;
}

Assistant:

void Cnf_CollectVolume( Aig_Man_t * p, Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    Vec_PtrClear( vNodes );
    Cnf_CollectVolume_rec( p, pRoot, vNodes );
}